

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O3

int WebPPictureHasTransparency(WebPPicture *picture)

{
  int iVar1;
  int iVar2;
  uint32_t *puVar3;
  int iVar4;
  uint8_t *puVar5;
  int iVar6;
  
  if (picture != (WebPPicture *)0x0) {
    if (picture->use_argb == 0) {
      puVar5 = picture->a;
      if (puVar5 != (uint8_t *)0x0) {
        iVar1 = picture->width;
        iVar6 = picture->height;
        iVar2 = picture->a_stride;
        WebPInitAlphaProcessing();
        if (0 < iVar6) {
          iVar6 = iVar6 + 1;
          do {
            iVar4 = (*WebPHasAlpha8b)(puVar5,iVar1);
            if (iVar4 != 0) {
              return 1;
            }
            puVar5 = puVar5 + iVar2;
            iVar6 = iVar6 + -1;
          } while (1 < iVar6);
        }
      }
    }
    else {
      puVar3 = picture->argb;
      if (puVar3 != (uint32_t *)0x0) {
        iVar1 = picture->width;
        iVar6 = picture->height;
        iVar2 = picture->argb_stride;
        WebPInitAlphaProcessing();
        if (0 < iVar6) {
          puVar5 = (uint8_t *)((long)puVar3 + 3);
          iVar6 = iVar6 + 1;
          do {
            iVar4 = (*WebPHasAlpha32b)(puVar5,iVar1);
            if (iVar4 != 0) {
              return 1;
            }
            puVar5 = puVar5 + (iVar2 << 2);
            iVar6 = iVar6 + -1;
          } while (1 < iVar6);
        }
      }
    }
  }
  return 0;
}

Assistant:

int WebPPictureHasTransparency(const WebPPicture* picture) {
  if (picture == NULL) return 0;
  if (picture->use_argb) {
    if (picture->argb != NULL) {
      return CheckNonOpaque((const uint8_t*)picture->argb + ALPHA_OFFSET,
                            picture->width, picture->height,
                            4, picture->argb_stride * sizeof(*picture->argb));
    }
    return 0;
  }
  return CheckNonOpaque(picture->a, picture->width, picture->height,
                        1, picture->a_stride);
}